

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O3

bool google::protobuf::internal::AllAreInitialized<google::protobuf::DescriptorProto>
               (RepeatedPtrField<google::protobuf::DescriptorProto> *t)

{
  int iVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *msg;
  int iVar3;
  
  iVar1 = (t->super_RepeatedPtrFieldBase).current_size_;
  do {
    iVar3 = iVar1;
    if (iVar3 < 1) break;
    msg = RepeatedPtrFieldBase::
          Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                    (&t->super_RepeatedPtrFieldBase,iVar3 + -1);
    bVar2 = DescriptorProto::IsInitializedImpl((MessageLite *)msg);
    iVar1 = iVar3 + -1;
  } while (bVar2);
  return iVar3 < 1;
}

Assistant:

bool AllAreInitialized(const RepeatedPtrField<Msg>& t) {
  for (int i = t.size(); --i >= 0;) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}